

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O2

unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> __thiscall
duckdb::ArrowType::GetArrowLogicalType(ArrowType *this,DBConfig *config,ArrowSchema *schema)

{
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> __p;
  pointer pAVar1;
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> dictionary;
  __uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  GetTypeFromSchema(this,config,schema);
  if (schema->dictionary != (ArrowSchema *)0x0) {
    GetArrowLogicalType((ArrowType *)&stack0xffffffffffffffd8,config,schema->dictionary);
    pAVar1 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::operator->
                       ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                         *)this);
    __p._M_t.super___uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>.
    super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true,_true>)
         (__uniq_ptr_data<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true,_true>)
         local_28._M_t.
         super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>.
         super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl;
    local_28._M_t.
    super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>.
    super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl =
         (tuple<duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>)
         (_Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>)0x0;
    local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ::std::__uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::reset
              ((__uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> *)
               &pAVar1->dictionary_type,
               (pointer)__p._M_t.
                        super___uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>
                        .super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl);
    ::std::unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::~unique_ptr
              ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> *)
               &stack0xffffffffffffffe0);
    ::std::unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::~unique_ptr
              ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> *)
               &stack0xffffffffffffffd8);
  }
  return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)this;
}

Assistant:

unique_ptr<ArrowType> ArrowType::GetArrowLogicalType(DBConfig &config, ArrowSchema &schema) {
	auto arrow_type = ArrowType::GetTypeFromSchema(config, schema);
	if (schema.dictionary) {
		auto dictionary = GetArrowLogicalType(config, *schema.dictionary);
		arrow_type->SetDictionary(std::move(dictionary));
	}
	return arrow_type;
}